

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O3

MPP_RET vepu540c_h265_setup_hal_bufs(H265eV540cHalContext *ctx)

{
  MppBufferGroup *group;
  uint uVar1;
  int iVar2;
  Vepu541Fmt VVar3;
  VepuFmtCfg *cfg;
  MppEncCfgSet *pMVar4;
  MppEncRefCfg ref;
  MppEncCfgSet *pMVar5;
  MppEncCpbInfo *pMVar6;
  int iVar7;
  MPP_RET MVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  RK_S32 RVar13;
  uint uVar14;
  ulong uVar15;
  size_t local_48;
  long local_40;
  long local_38;
  
  cfg = (VepuFmtCfg *)ctx->input_fmt;
  pMVar4 = ctx->cfg;
  ref = pMVar4->ref_cfg;
  uVar1 = ctx->max_buf_cnt;
  iVar11 = (pMVar4->prep).width;
  pMVar5 = pMVar4;
  RVar13 = iVar11;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x89);
    RVar13 = (pMVar4->prep).width;
    pMVar5 = ctx->cfg;
  }
  iVar7 = RVar13 + 0x7e;
  if (-1 < RVar13 + 0x3f) {
    iVar7 = RVar13 + 0x3f;
  }
  iVar2 = (pMVar4->prep).height;
  iVar10 = iVar2 + 0x7e;
  if (-1 < iVar2 + 0x3f) {
    iVar10 = iVar2 + 0x3f;
  }
  vepu541_set_fmt(cfg,(pMVar5->prep).format);
  VVar3 = cfg->format;
  if (VVar3 < VEPU540_FMT_BUTT) {
    uVar12 = (iVar2 + 0xfU & 0xffffff0) * (RVar13 + 0xfU & 0xfffffff0);
    switch(VVar3) {
    case VEPU541_FMT_BGRA8888:
      uVar12 = uVar12 * 4;
      break;
    case VEPU541_FMT_BGR888:
      uVar12 = uVar12 * 3;
      break;
    default:
      uVar12 = uVar12 * 2;
      break;
    case VEPU541_FMT_NONE:
      goto switchD_00258ab2_caseD_3;
    case VEPU541_FMT_YUV420SP:
    case VEPU541_FMT_YUV420P:
      uVar12 = uVar12 * 3 >> 1;
      break;
    case VEPU540_FMT_YUV400:
      break;
    }
    uVar9 = iVar11 + 0x1f;
    if (ref == (MppEncRefCfg)0x0) {
      uVar14 = 2;
    }
    else {
      pMVar6 = mpp_enc_ref_cfg_get_cpb_info(ref);
      uVar14 = 2;
      if (0 < pMVar6->dpb_size) {
        uVar14 = pMVar6->dpb_size + 1;
      }
    }
    if ((int)(uVar9 & 0xffffffe0) < 0xc01) {
      if (ctx->ext_line_buf != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(ctx->ext_line_buf,"vepu540c_h265_setup_hal_bufs");
        ctx->ext_line_buf = (MppBuffer)0x0;
      }
      uVar9 = 0;
      if (ctx->ext_line_buf_grp != (MppBufferGroup)0x0) {
        mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        mpp_buffer_group_put(ctx->ext_line_buf_grp);
        ctx->ext_line_buf_grp = (MppBufferGroup)0x0;
        uVar9 = 0;
      }
    }
    else {
      uVar9 = (uVar9 >> 5) * 0x1a0 - 0x93e0;
      group = &ctx->ext_line_buf_grp;
      if (ctx->ext_line_buf_grp == (MppBufferGroup)0x0) {
        mpp_buffer_group_get
                  (group,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v540c",
                   "vepu540c_h265_setup_hal_bufs");
      }
      else if (uVar9 != ctx->ext_line_buf_size) {
        mpp_buffer_put_with_caller(ctx->ext_line_buf,"vepu540c_h265_setup_hal_bufs");
        ctx->ext_line_buf = (MppBuffer)0x0;
        mpp_buffer_group_clear(ctx->ext_line_buf_grp);
      }
      if ((*group == (MppBufferGroup)0x0) &&
         (_mpp_log_l(2,"hal_h265e_v540c","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ctx->ext_line_buf_grp","vepu540c_h265_setup_hal_bufs",0xbb),
         (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      if (ctx->ext_line_buf == (MppBuffer)0x0) {
        mpp_buffer_get_with_tag
                  (*group,&ctx->ext_line_buf,(ulong)uVar9,"hal_h265e_v540c",
                   "vepu540c_h265_setup_hal_bufs");
      }
    }
    ctx->ext_line_buf_size = uVar9;
    if ((ctx->frame_size < uVar12) || ((int)uVar1 < (int)uVar14)) {
      iVar11 = (iVar10 >> 6) * (iVar7 >> 6);
      hal_bufs_deinit(ctx->dpb_bufs);
      hal_bufs_init(&ctx->dpb_bufs);
      uVar9 = iVar11 * 0x40 + 0x1fffU & 0xffffe000;
      ctx->fbc_header_len = uVar9;
      local_48 = (size_t)(int)((iVar11 * 0x3000 >> 1) + uVar9);
      local_40 = (long)(iVar11 * 0x100);
      local_38 = (long)(int)(iVar11 * 0x400 + 0xff0U & 0xfffff000);
      uVar15 = (ulong)uVar14;
      if ((int)uVar14 <= (int)uVar1) {
        uVar15 = (ulong)uVar1;
      }
      if (((byte)hal_h265e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h265e_v540c","frame size %d -> %d max count %d -> %d\n",(char *)0x0,
                   (ulong)ctx->frame_size,(ulong)uVar12,(ulong)uVar1,uVar15);
      }
      hal_bufs_setup(ctx->dpb_bufs,(RK_S32)uVar15,3,&local_48);
      ctx->frame_size = uVar12;
      ctx->max_buf_cnt = (RK_S32)uVar15;
    }
    MVar8 = MPP_OK;
    if (((byte)hal_h265e_debug & 4) != 0) {
      MVar8 = MPP_OK;
      _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0xe3);
    }
  }
  else {
switchD_00258ab2_caseD_3:
    _mpp_log_l(2,"hal_h265e_v540c","invalid src color space: %d\n","vepu540c_h265_setup_hal_bufs");
    MVar8 = MPP_NOK;
  }
  return MVar8;
}

Assistant:

static MPP_RET vepu540c_h265_setup_hal_bufs(H265eV540cHalContext *ctx)
{
    MPP_RET ret = MPP_OK;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    RK_U32 frame_size;
    Vepu541Fmt input_fmt = VEPU541_FMT_YUV420P;
    RK_S32 mb_wd64, mb_h64;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 2;
    RK_S32 alignment = 32;
    RK_S32 aligned_w = MPP_ALIGN(prep->width,  alignment);

    hal_h265e_enter();

    mb_wd64 = (prep->width + 63) / 64;
    mb_h64 = (prep->height + 63) / 64;

    frame_size = MPP_ALIGN(prep->width, 16) * MPP_ALIGN(prep->height, 16);
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);
    input_fmt = (Vepu541Fmt)fmt->format;
    switch (input_fmt) {
    case VEPU540_FMT_YUV400:
        break;
    case VEPU541_FMT_YUV420P:
    case VEPU541_FMT_YUV420SP: {
        frame_size = frame_size * 3 / 2;
    } break;
    case VEPU541_FMT_YUV422P:
    case VEPU541_FMT_YUV422SP:
    case VEPU541_FMT_YUYV422:
    case VEPU541_FMT_UYVY422:
    case VEPU541_FMT_BGR565: {
        frame_size *= 2;
    } break;
    case VEPU541_FMT_BGR888: {
        frame_size *= 3;
    } break;
    case VEPU541_FMT_BGRA8888: {
        frame_size *= 4;
    } break;
    default: {
        hal_h265e_err("invalid src color space: %d\n", input_fmt);
        return MPP_NOK;
    }
    }

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (aligned_w > (3 * SZ_1K)) {
        RK_S32 ext_line_buf_size = (aligned_w / 32 - 91) * 26 * 16;

        if (NULL == ctx->ext_line_buf_grp)
            mpp_buffer_group_get_internal(&ctx->ext_line_buf_grp, MPP_BUFFER_TYPE_ION);
        else if (ext_line_buf_size != ctx->ext_line_buf_size) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        }

        mpp_assert(ctx->ext_line_buf_grp);

        if (NULL == ctx->ext_line_buf)
            mpp_buffer_get(ctx->ext_line_buf_grp, &ctx->ext_line_buf, ext_line_buf_size);

        ctx->ext_line_buf_size = ext_line_buf_size;
    } else {
        if (ctx->ext_line_buf) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
        }

        if (ctx->ext_line_buf_grp) {
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
            mpp_buffer_group_put(ctx->ext_line_buf_grp);
            ctx->ext_line_buf_grp = NULL;
        }
        ctx->ext_line_buf_size = 0;
    }

    if (frame_size > ctx->frame_size || new_max_cnt > old_max_cnt) {
        size_t size[3] = {0};

        hal_bufs_deinit(ctx->dpb_bufs);
        hal_bufs_init(&ctx->dpb_bufs);

        ctx->fbc_header_len = MPP_ALIGN(((mb_wd64 * mb_h64) << 6), SZ_8K);
        size[0] = ctx->fbc_header_len + ((mb_wd64 * mb_h64) << 12) * 3 / 2; //fbc_h + fbc_b
        size[1] = (mb_wd64 * mb_h64 << 8);
        size[2] = MPP_ALIGN(mb_wd64 * mb_h64 * 16 * 4, 256) * 16;
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_h265e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->frame_size, frame_size, old_max_cnt, new_max_cnt);

        hal_bufs_setup(ctx->dpb_bufs, new_max_cnt, 3, size);

        ctx->frame_size = frame_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
    hal_h265e_leave();
    return ret;
}